

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O2

Result<std::vector<char,_std::allocator<char>_>_> *
wasm::WATParser::anon_unknown_11::datastring<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
          (Result<std::vector<char,_std::allocator<char>_>_> *__return_storage_ptr__,
          ParseDeclsCtx *ctx)

{
  undefined1 local_60 [8];
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> str;
  vector<char,_std::allocator<char>_> data;
  
  str.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_engaged = false;
  str.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _17_7_ = 0;
  while( true ) {
    ParseInput::takeString
              ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_60,&ctx->in
              );
    if (str.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_payload._8_1_ == '\0') break;
    std::vector<char,std::allocator<char>>::insert<char_const*,void>
              ((vector<char,std::allocator<char>> *)
               &str.
                super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                ._M_engaged,(const_iterator)0x0,
               (char *)str.
                       super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                       ._M_payload._M_value._M_len,
               (char *)((long)local_60 +
                       str.
                       super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                       ._M_payload._M_value._M_len));
  }
  *(undefined8 *)
   &(__return_storage_ptr__->val).
    super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::WATParser::Err>.
    super__Move_assign_alias<std::vector<char>,_wasm::WATParser::Err>.
    super__Copy_assign_alias<std::vector<char>,_wasm::WATParser::Err>.
    super__Move_ctor_alias<std::vector<char>,_wasm::WATParser::Err>.
    super__Copy_ctor_alias<std::vector<char>,_wasm::WATParser::Err>.
    super__Variant_storage_alias<std::vector<char>,_wasm::WATParser::Err> =
       str.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
       _M_payload.
       super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._16_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::WATParser::Err>.
           super__Move_assign_alias<std::vector<char>,_wasm::WATParser::Err>.
           super__Copy_assign_alias<std::vector<char>,_wasm::WATParser::Err>.
           super__Move_ctor_alias<std::vector<char>,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<std::vector<char>,_wasm::WATParser::Err>.
           super__Variant_storage_alias<std::vector<char>,_wasm::WATParser::Err> + 8) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::WATParser::Err>.
           super__Move_assign_alias<std::vector<char>,_wasm::WATParser::Err>.
           super__Copy_assign_alias<std::vector<char>,_wasm::WATParser::Err>.
           super__Move_ctor_alias<std::vector<char>,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<std::vector<char>,_wasm::WATParser::Err>.
           super__Variant_storage_alias<std::vector<char>,_wasm::WATParser::Err> + 0x10) = 0;
  str.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_engaged = false;
  str.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _17_7_ = 0;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::WATParser::Err>.
           super__Move_assign_alias<std::vector<char>,_wasm::WATParser::Err>.
           super__Copy_assign_alias<std::vector<char>,_wasm::WATParser::Err>.
           super__Move_ctor_alias<std::vector<char>,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<std::vector<char>,_wasm::WATParser::Err>.
           super__Variant_storage_alias<std::vector<char>,_wasm::WATParser::Err> + 0x20) = '\0';
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)
             &str.
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              _M_engaged);
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::DataStringT> datastring(Ctx& ctx) {
  auto data = ctx.makeDataString();
  while (auto str = ctx.in.takeString()) {
    ctx.appendDataString(data, *str);
  }
  return data;
}